

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlat<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,false>
               (Vector *left,Vector *right,Vector *result,idx_t count,bool fun)

{
  byte fun_00;
  bool bVar1;
  TemplatedValidityMask<unsigned_long> *this;
  TemplatedValidityMask<unsigned_long> *count_00;
  ValidityMask *in_RCX;
  Vector *in_RDX;
  uchar *in_RSI;
  ValidityMask *in_RDI;
  byte in_R8B;
  ValidityMask *unaff_retaddr;
  ValidityMask *result_validity;
  uchar *result_data;
  uchar *rdata;
  uchar *ldata;
  ValidityMask *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffffb8;
  VectorType vector_type_p;
  TemplatedValidityMask<unsigned_long> *other;
  Vector *in_stack_ffffffffffffffc0;
  Vector *pVVar2;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  fun_00 = in_R8B & 1;
  FlatVector::GetData<unsigned_char>((Vector *)0x12ce55b);
  FlatVector::GetData<unsigned_char>((Vector *)0x12ce56a);
  Vector::SetVectorType(in_stack_ffffffffffffffc0,vector_type_p);
  this = (TemplatedValidityMask<unsigned_long> *)
         FlatVector::GetData<unsigned_char>((Vector *)0x12ce585);
  count_00 = &FlatVector::Validity((Vector *)0x12ce594)->super_TemplatedValidityMask<unsigned_long>;
  bVar1 = BinaryStandardOperatorWrapper::AddsNulls();
  if (bVar1) {
    other = count_00;
    FlatVector::Validity((Vector *)0x12ce5bb);
    TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(other);
    if (bVar1) {
      FlatVector::Validity((Vector *)0x12ce5f1);
      TemplatedValidityMask<unsigned_long>::Copy(this,other,(idx_t)count_00);
    }
    else {
      FlatVector::Validity((Vector *)0x12ce619);
      ValidityMask::Combine(unaff_retaddr,in_RDI,(idx_t)in_RSI);
    }
  }
  else {
    pVVar2 = in_RDX;
    FlatVector::Validity((Vector *)0x12ce641);
    FlatVector::SetValidity(in_RDX,in_stack_ffffffffffffff88);
    FlatVector::Validity((Vector *)0x12ce662);
    ValidityMask::Combine(unaff_retaddr,in_RDI,(idx_t)in_RSI);
    in_RDX = pVVar2;
  }
  ExecuteFlatLoop<unsigned_char,unsigned_char,unsigned_char,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractOperator,bool,false,false>
            ((uchar *)unaff_retaddr,(uchar *)in_RDI,in_RSI,(idx_t)in_RDX,in_RCX,(bool)fun_00);
  return;
}

Assistant:

static void ExecuteFlat(Vector &left, Vector &right, Vector &result, idx_t count, FUNC fun) {
		auto ldata = FlatVector::GetData<LEFT_TYPE>(left);
		auto rdata = FlatVector::GetData<RIGHT_TYPE>(right);

		if ((LEFT_CONSTANT && ConstantVector::IsNull(left)) || (RIGHT_CONSTANT && ConstantVector::IsNull(right))) {
			// either left or right is constant NULL: result is constant NULL
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(result, true);
			return;
		}

		result.SetVectorType(VectorType::FLAT_VECTOR);
		auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
		auto &result_validity = FlatVector::Validity(result);
		if (LEFT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(right), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(right));
			}
		} else if (RIGHT_CONSTANT) {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
			}
		} else {
			if (OPWRAPPER::AddsNulls()) {
				result_validity.Copy(FlatVector::Validity(left), count);
				if (result_validity.AllValid()) {
					result_validity.Copy(FlatVector::Validity(right), count);
				} else {
					result_validity.Combine(FlatVector::Validity(right), count);
				}
			} else {
				FlatVector::SetValidity(result, FlatVector::Validity(left));
				result_validity.Combine(FlatVector::Validity(right), count);
			}
		}
		ExecuteFlatLoop<LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE, OPWRAPPER, OP, FUNC, LEFT_CONSTANT, RIGHT_CONSTANT>(
		    ldata, rdata, result_data, count, result_validity, fun);
	}